

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void __thiscall
Assimp::glTFExporter::GetTexSampler(glTFExporter *this,aiMaterial *mat,TexProperty *prop)

{
  Asset *this_00;
  Texture *pTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Ref<glTF::Sampler> RVar4;
  aiTextureMapMode mapV;
  aiTextureMapMode mapU;
  string samplerId;
  uint local_6c;
  string local_68;
  string local_48;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  glTF::Asset::FindUniqueID(&local_48,this_00,&local_68,"sampler");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  RVar4 = glTF::LazyDict<glTF::Sampler>::Create
                    (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->samplers,local_48._M_dataplus._M_p);
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  (pTVar1->sampler).vector = RVar4.vector;
  *(uint *)((long)&pTVar1->sampler + 8) = RVar4.index;
  aiGetMaterialIntegerArray(mat,"$tex.mapmodeu",1,0,(int *)&local_68,(uint *)0x0);
  aiGetMaterialIntegerArray(mat,"$tex.mapmodev",1,0,(int *)&local_6c,(uint *)0x0);
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  uVar2 = 0x2901;
  uVar3 = 0x2901;
  if (((ulong)local_68._M_dataplus._M_p & 0xffffffff) < 3) {
    uVar3 = *(undefined4 *)(&DAT_006d240c + ((ulong)local_68._M_dataplus._M_p & 0xffffffff) * 4);
  }
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x50) = uVar3;
  if ((ulong)local_6c < 3) {
    uVar2 = *(undefined4 *)(&DAT_006d240c + (ulong)local_6c * 4);
  }
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x54) = uVar2;
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x48) = 0x2601;
  pTVar1 = (((prop->texture).vector)->
           super__Vector_base<glTF::Texture_*,_std::allocator<glTF::Texture_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(prop->texture).index];
  *(undefined4 *)
   (*(long *)(*(long *)(pTVar1->sampler).vector + (ulong)*(uint *)((long)&pTVar1->sampler + 8) * 8)
   + 0x4c) = 0x2601;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void glTFExporter::GetTexSampler(const aiMaterial* mat, glTF::TexProperty& prop)
{
    std::string samplerId = mAsset->FindUniqueID("", "sampler");
    prop.texture->sampler = mAsset->samplers.Create(samplerId);

    aiTextureMapMode mapU, mapV;
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0),(int*)&mapU);
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0),(int*)&mapV);

    switch (mapU) {
        case aiTextureMapMode_Wrap:
            prop.texture->sampler->wrapS = SamplerWrap_Repeat;
            break;
        case aiTextureMapMode_Clamp:
            prop.texture->sampler->wrapS = SamplerWrap_Clamp_To_Edge;
            break;
        case aiTextureMapMode_Mirror:
            prop.texture->sampler->wrapS = SamplerWrap_Mirrored_Repeat;
            break;
        case aiTextureMapMode_Decal:
        default:
            prop.texture->sampler->wrapS = SamplerWrap_Repeat;
            break;
    };

    switch (mapV) {
        case aiTextureMapMode_Wrap:
            prop.texture->sampler->wrapT = SamplerWrap_Repeat;
            break;
        case aiTextureMapMode_Clamp:
            prop.texture->sampler->wrapT = SamplerWrap_Clamp_To_Edge;
            break;
        case aiTextureMapMode_Mirror:
            prop.texture->sampler->wrapT = SamplerWrap_Mirrored_Repeat;
            break;
        case aiTextureMapMode_Decal:
        default:
            prop.texture->sampler->wrapT = SamplerWrap_Repeat;
            break;
    };

    // Hard coded Texture filtering options because I do not know where to find them in the aiMaterial.
    prop.texture->sampler->magFilter = SamplerMagFilter_Linear;
    prop.texture->sampler->minFilter = SamplerMinFilter_Linear;
}